

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O0

int alex::fanout_tree::find_best_fanout_existing_node<int,int>
              (AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *parent,int bucketID,
              int total_keys,
              vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              *used_fanout_tree_nodes,int max_fanout)

{
  undefined1 auVar1 [64];
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference fanout_tree_00;
  iterator best_cost_00;
  iterator used_fanout_tree_nodes_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  double dVar5;
  FTNode *tree_node;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  double traversal_cost;
  double node_cost;
  DataNodeStats stats;
  double empirical_insert_frac;
  int j;
  LinearModelBuilder<int> builder;
  const_iterator_type it;
  LinearModel<int> model;
  int num_actual_keys;
  int i;
  int right_boundary;
  int left_boundary;
  double b;
  double a;
  double cost;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> new_level;
  int fanout_tree_level;
  int fanout;
  double right_boundary_value;
  double left_boundary_value;
  LinearModel<int> base_model;
  int end_bucketID;
  int start_bucketID;
  int repeats;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  fanout_tree;
  vector<double,_std::allocator<double>_> fanout_costs;
  double best_cost;
  int best_level;
  int num_keys;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *node;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  int iVar6;
  LinearModelBuilder<int> *in_stack_fffffffffffffd40;
  value_type *in_stack_fffffffffffffd48;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  int iVar7;
  reference in_stack_fffffffffffffd78;
  DataNodeStats local_208;
  double local_1f8;
  int local_1ec;
  DataNodeStats *in_stack_fffffffffffffe70;
  LinearModel<int> *in_stack_fffffffffffffe78;
  double in_stack_fffffffffffffe80;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  self_type *in_stack_fffffffffffffe98;
  LinearModel<int> local_160;
  int local_14c;
  undefined1 local_148 [16];
  int iStack_138;
  int iStack_134;
  undefined1 uStack_130;
  undefined1 auStack_12f [39];
  undefined4 local_108;
  double local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  double local_d0;
  double local_c8;
  double local_c0;
  int local_a0;
  int local_9c;
  double local_98;
  double local_90;
  LinearModel<int> local_88;
  int local_74;
  int local_70;
  int local_6c;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  local_68;
  vector<double,_std::allocator<double>_> local_50;
  double local_38;
  int local_30;
  int local_2c;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_28;
  int local_1c;
  int local_10;
  int local_c;
  long local_8;
  
  local_28 = *(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
               **)(*(long *)(in_RDI + 0x38) + (long)in_ESI * 8);
  local_2c = local_28->num_keys_;
  local_30 = 0;
  local_1c = in_R8D;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_38 = std::numeric_limits<double>::max();
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x114b55);
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::vector((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
            *)0x114b62);
  local_6c = 1 << ((local_28->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  local_70 = local_c - local_c % local_6c;
  local_74 = local_70 + local_6c;
  LinearModel<int>::LinearModel(&local_88);
  if ((*(double *)(local_8 + 0x10) != 0.0) || (NAN(*(double *)(local_8 + 0x10)))) {
    local_90 = ((double)local_70 - *(double *)(local_8 + 0x18)) / *(double *)(local_8 + 0x10);
    local_98 = ((double)local_74 - *(double *)(local_8 + 0x18)) / *(double *)(local_8 + 0x10);
    local_88.a_ = 1.0 / (local_98 - local_90);
    local_88.b_ = local_88.a_ * -1.0 * local_90;
  }
  else {
    local_88.a_ = 0.0;
    local_88.b_ = (((double)local_70 - *(double *)(local_8 + 0x18)) * -1.0) / (double)local_6c;
  }
  local_a0 = 0;
  iVar6 = local_c;
  for (local_9c = 1; local_9c <= local_1c; local_9c = local_9c << 1) {
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::vector
              ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               0x114d01);
    local_c0 = 0.0;
    local_c8 = local_88.a_ * (double)local_9c;
    local_d0 = local_88.b_ * (double)local_9c;
    local_d4 = 0;
    local_d8 = 0;
    for (local_dc = 0; local_dc < local_9c; local_dc = local_dc + 1) {
      local_d4 = local_d8;
      if (local_dc == local_9c + -1) {
        iVar7 = local_28->data_capacity_;
      }
      else {
        local_e8 = ((double)(local_dc + 1) - local_d0) / local_c8;
        in_stack_fffffffffffffd6c =
             AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             lower_bound<double>(in_stack_fffffffffffffd50,(double *)in_stack_fffffffffffffd48);
        iVar7 = in_stack_fffffffffffffd6c;
      }
      local_d8 = iVar7;
      if (local_d4 == iVar7) {
        auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
        local_108 = 0;
        stack0xfffffffffffffec0 = auVar1._8_56_;
        local_148._4_4_ = local_dc;
        local_148._0_4_ = local_a0;
        iStack_138 = local_d4;
        iStack_134 = iVar7;
        auStack_12f = auVar1._25_39_;
        uStack_130 = 0;
        std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
        push_back((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
                  in_stack_fffffffffffffd40,
                  (value_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      }
      else {
        local_14c = 0;
        LinearModel<int>::LinearModel(&local_160);
        AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
        Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
        ::Iterator((Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
                    *)in_stack_fffffffffffffd40,
                   (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                    *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),0);
        LinearModelBuilder<int>::LinearModelBuilder
                  (in_stack_fffffffffffffd40,
                   (LinearModel<int> *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                  );
        local_1ec = 0;
        while( true ) {
          in_stack_fffffffffffffd68 = in_stack_fffffffffffffd68 & 0xffffff;
          if (in_stack_fffffffffffffe90 < local_d8) {
            bVar2 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                    ::
                    Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
                    ::is_end((Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
                              *)&stack0xfffffffffffffe88);
            in_stack_fffffffffffffd68 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd68) ^ 0xff000000
            ;
          }
          if ((in_stack_fffffffffffffd68 & 0x1000000) == 0) break;
          AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
          Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
          ::key((Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
                 *)&stack0xfffffffffffffe88);
          LinearModelBuilder<int>::add
                    ((LinearModelBuilder<int> *)CONCAT44(iVar6,iVar7),in_stack_fffffffffffffd6c,
                     in_stack_fffffffffffffd68);
          local_14c = local_14c + 1;
          AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
          Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
          ::operator++((Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
                        *)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
          ;
          local_1ec = local_1ec + 1;
        }
        LinearModelBuilder<int>::build((LinearModelBuilder<int> *)&stack0xfffffffffffffe18);
        local_1f8 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                    ::frac_inserts(local_28);
        DataNodeStats::DataNodeStats(&local_208);
        dVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                ::compute_expected_cost_from_existing
                          (in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                           in_stack_fffffffffffffe90,(double)in_stack_fffffffffffffe88,
                           in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                           in_stack_fffffffffffffe70);
        local_c0 = local_c0 + (dVar5 * (double)local_14c) / (double)local_2c;
        std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
        push_back((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
                  in_stack_fffffffffffffd40,
                  (value_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      }
    }
    local_c0 = local_c0 +
               ((double)local_9c * 5e-07 * 208.0 * (double)local_10) / (double)local_2c + 20.0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd50,
               (value_type_conflict *)in_stack_fffffffffffffd48);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_50);
    if (sVar3 < 3) {
LAB_00115287:
      if (local_c0 < local_38) {
        local_38 = local_c0;
        local_30 = local_a0;
      }
      std::
      vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
      ::push_back((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                   *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      bVar2 = false;
    }
    else {
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_50);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,sVar3 - 1);
      in_stack_fffffffffffffd50 =
           (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
           *pvVar4;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_50);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,sVar3 - 2);
      if ((double)in_stack_fffffffffffffd50 <= *pvVar4) goto LAB_00115287;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_50);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,sVar3 - 2);
      in_stack_fffffffffffffd48 = (value_type *)*pvVar4;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_50);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,sVar3 - 3);
      if ((double)in_stack_fffffffffffffd48 <= *pvVar4) goto LAB_00115287;
      bVar2 = true;
    }
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::~vector
              ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               in_stack_fffffffffffffd50);
    if (bVar2) break;
    local_a0 = local_a0 + 1;
  }
  fanout_tree_00 =
       std::
       vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
       ::operator[](&local_68,(long)local_30);
  best_cost_00 = std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 ::begin((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                          *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  used_fanout_tree_nodes_00 =
       std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::end
                 ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
                  CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                             *)in_stack_fffffffffffffd40,
                            (__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)), bVar2
        ) {
    in_stack_fffffffffffffd78 =
         __gnu_cxx::
         __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
         ::operator*((__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                      *)&stack0xfffffffffffffd88);
    in_stack_fffffffffffffd78->use = true;
    __gnu_cxx::
    __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
    ::operator++((__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                  *)&stack0xfffffffffffffd88);
  }
  merge_nodes_upwards<int,int>
            ((int)((ulong)fanout_tree_00 >> 0x20),(double)best_cost_00._M_current,
             (int)((ulong)used_fanout_tree_nodes_00._M_current >> 0x20),
             (int)used_fanout_tree_nodes_00._M_current,
             (vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
              *)in_stack_fffffffffffffd78);
  collect_used_nodes((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                      *)fanout_tree_00,(int)((ulong)best_cost_00._M_current >> 0x20),
                     (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      *)used_fanout_tree_nodes_00._M_current);
  iVar6 = local_30;
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::~vector((vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
             *)in_stack_fffffffffffffd50);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd50);
  return iVar6;
}

Assistant:

int find_best_fanout_existing_node(const AlexModelNode<T, P>* parent,
                                   int bucketID, int total_keys,
                                   std::vector<FTNode>& used_fanout_tree_nodes,
                                   int max_fanout) {
  // Repeatedly add levels to the fanout tree until the overall cost of each
  // level starts to increase
  auto node = static_cast<AlexDataNode<T, P>*>(parent->children_[bucketID]);
  int num_keys = node->num_keys_;
  int best_level = 0;
  double best_cost = std::numeric_limits<double>::max();
  std::vector<double> fanout_costs;
  std::vector<std::vector<FTNode>> fanout_tree;

  int repeats = 1 << node->duplication_factor_;
  int start_bucketID =
      bucketID - (bucketID % repeats);  // first bucket with same child
  int end_bucketID =
      start_bucketID + repeats;  // first bucket with different child
  LinearModel<T> base_model;
  if (parent->model_.a_ == 0){
    base_model.a_ = 0;
    base_model.b_ = -1.0 * (start_bucketID - parent->model_.b_) / repeats;
  }
  else{
    double left_boundary_value =
      (start_bucketID - parent->model_.b_) / parent->model_.a_;
    double right_boundary_value =
        (end_bucketID - parent->model_.b_) / parent->model_.a_;
    base_model.a_ = 1.0 / (right_boundary_value - left_boundary_value);
    base_model.b_ = -1.0 * base_model.a_ * left_boundary_value;
  }

  for (int fanout = 1, fanout_tree_level = 0; fanout <= max_fanout;
       fanout *= 2, fanout_tree_level++) {
    std::vector<FTNode> new_level;
    double cost = 0.0;
    double a = base_model.a_ * fanout;
    double b = base_model.b_ * fanout;
    int left_boundary = 0;
    int right_boundary = 0;
    for (int i = 0; i < fanout; i++) {
      left_boundary = right_boundary;
      right_boundary = i == fanout - 1 ? node->data_capacity_
                                       : node->lower_bound(((i + 1) - b) / a);
      if (left_boundary == right_boundary) {
        new_level.push_back({fanout_tree_level, i, 0, left_boundary,
                             right_boundary, false, 0, 0, 0, 0, 0});
        continue;
      }
      int num_actual_keys = 0;
      LinearModel<T> model;
      typename AlexDataNode<T, P>::const_iterator_type it(node, left_boundary);
      LinearModelBuilder<T> builder(&model);
      for (int j = 0; it.cur_idx_ < right_boundary && !it.is_end(); it++, j++) {
        builder.add(it.key(), j);
        num_actual_keys++;
      }
      builder.build();

      double empirical_insert_frac = node->frac_inserts();
      DataNodeStats stats;
      double node_cost =
          AlexDataNode<T, P>::compute_expected_cost_from_existing(
              node, left_boundary, right_boundary,
              AlexDataNode<T, P>::kInitDensity_, empirical_insert_frac, &model,
              &stats);

      cost += node_cost * num_actual_keys / num_keys;

      new_level.push_back({fanout_tree_level, i, node_cost, left_boundary,
                           right_boundary, false, stats.num_search_iterations,
                           stats.num_shifts, model.a_, model.b_,
                           num_actual_keys});
    }
    // model weight reflects that it has global effect, not local effect
    double traversal_cost =
        kNodeLookupsWeight +
        (kModelSizeWeight * fanout *
         (sizeof(AlexDataNode<T, P>) + sizeof(void*)) * total_keys / num_keys);
    cost += traversal_cost;
    fanout_costs.push_back(cost);
    // stop after expanding fanout increases cost twice in a row
    if (fanout_costs.size() >= 3 &&
        fanout_costs[fanout_costs.size() - 1] >
            fanout_costs[fanout_costs.size() - 2] &&
        fanout_costs[fanout_costs.size() - 2] >
            fanout_costs[fanout_costs.size() - 3]) {
      break;
    }
    if (cost < best_cost) {
      best_cost = cost;
      best_level = fanout_tree_level;
    }
    fanout_tree.push_back(new_level);
  }
  for (FTNode& tree_node : fanout_tree[best_level]) {
    tree_node.use = true;
  }

  // Merge nodes to improve cost
  merge_nodes_upwards<T, P>(best_level, best_cost, num_keys, total_keys,
                            fanout_tree);

  collect_used_nodes(fanout_tree, best_level, used_fanout_tree_nodes);
  return best_level;
}